

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
tinyusdz::Prim::get_child_indices_from_primChildren
          (Prim *this,bool force_update,bool *indices_is_valid)

{
  vector<long,_std::allocator<long>_> *this_00;
  pointer pPVar1;
  pointer plVar2;
  pointer plVar3;
  byte bVar4;
  bool bVar5;
  PrimMeta *pPVar6;
  ulong uVar7;
  iterator iVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  undefined7 in_register_00000031;
  long lVar11;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> table;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  m;
  string tok;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_80;
  key_type local_50;
  
  if ((int)CONCAT71(in_register_00000031,force_update) == 0) {
    if (((long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3 ==
         ((long)(this->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)(this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x350) && (this->_child_dirty == false))
    {
      if (indices_is_valid != (bool *)0x0) {
        *indices_is_valid = this->_primChildrenIndicesIsValid;
      }
      goto LAB_0013727b;
    }
    this->_child_dirty = false;
  }
  pPVar6 = metas(this);
  if ((pPVar6->primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (pPVar6->primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<long,_std::allocator<long>_>::resize
              (&this->_primChildrenIndices,
               ((long)(this->_children).
                      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->_children).
                     super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x350);
    plVar2 = (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar3 = (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar11 = 0;
    for (lVar9 = 0; (pointer)((long)plVar2 + lVar9) != plVar3; lVar9 = lVar9 + 8) {
      plVar2[lVar11] = lVar11;
      lVar11 = lVar11 + 1;
    }
    this->_primChildrenIndicesIsValid = true;
    if (indices_is_valid != (bool *)0x0) {
      *indices_is_valid = true;
    }
  }
  else {
    local_80._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_80._M_impl.super__Rb_tree_header._M_header;
    local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b0._M_impl._0_8_ = 0;
    local_80._M_impl.super__Rb_tree_header._M_header._M_right =
         local_80._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      pPVar1 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->_children).
                         super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pPVar1) / 0x350) <=
          (ulong)local_b0._M_impl._0_8_) break;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,unsigned_long&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)&local_80,&pPVar1[local_b0._M_impl._0_8_]._elementPath._prim_part,
                 (unsigned_long *)&local_b0);
      local_b0._M_impl._0_8_ = local_b0._M_impl._0_8_ + 1;
    }
    local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b0._M_impl.super__Rb_tree_header._M_header;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = &this->_primChildrenIndices;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
    pPVar6 = metas(this);
    std::vector<long,_std::allocator<long>_>::resize
              (this_00,(long)(pPVar6->primChildren).
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pPVar6->primChildren).
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5);
    bVar4 = 1;
    lVar9 = 0;
    for (uVar10 = 0;
        uVar7 = (long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3, uVar10 < uVar7;
        uVar10 = uVar10 + 1) {
      pPVar6 = metas(this);
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 ((long)&(((pPVar6->primChildren).
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p + lVar9
                 ));
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::find(&local_80,&local_50);
      if ((_Rb_tree_header *)iVar8._M_node == &local_80._M_impl.super__Rb_tree_header) {
        (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar10] = -1;
        bVar4 = 0;
      }
      else {
        (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar10] = *(long *)(iVar8._M_node + 2);
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&local_b0,(unsigned_long *)(iVar8._M_node + 2));
      }
      std::__cxx11::string::_M_dispose();
      lVar9 = lVar9 + 0x20;
    }
    bVar5 = (bool)(local_b0._M_impl.super__Rb_tree_header._M_node_count == uVar7 & bVar4);
    this->_primChildrenIndicesIsValid = bVar5;
    if (indices_is_valid != (bool *)0x0) {
      *indices_is_valid = bVar5;
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_80);
  }
LAB_0013727b:
  return &this->_primChildrenIndices;
}

Assistant:

const std::vector<int64_t> &Prim::get_child_indices_from_primChildren(
    bool force_update, bool *indices_is_valid) const {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (!force_update && (_primChildrenIndices.size() == _children.size()) &&
      !_child_dirty) {
    // got cache.
    if (indices_is_valid) {
      (*indices_is_valid) = _primChildrenIndicesIsValid;
    }
    return _primChildrenIndices;
  }

  if (!force_update) {
    _child_dirty = false;
  }

  if (metas().primChildren.empty()) {
    _primChildrenIndices.resize(_children.size());
    std::iota(_primChildrenIndices.begin(), _primChildrenIndices.end(), 0);
    _primChildrenIndicesIsValid = true;
    if (indices_is_valid) {
      (*indices_is_valid) = _primChildrenIndicesIsValid;
    }
    return _primChildrenIndices;
  }

  std::map<std::string, size_t> m;  // name -> children() index map
  for (size_t i = 0; i < _children.size(); i++) {
    m.emplace(_children[i].element_name(), i);
  }
  std::set<size_t> table;  // to check uniqueness

  // Use the length of primChildren.
  _primChildrenIndices.resize(metas().primChildren.size());

  bool valid = true;

  for (size_t i = 0; i < _primChildrenIndices.size(); i++) {
    std::string tok = metas().primChildren[i].str();
    const auto it = m.find(tok);
    if (it != m.end()) {
      _primChildrenIndices[i] = int64_t(it->second);

      table.insert(it->second);
    } else {
      // Prim name not found.
      _primChildrenIndices[i] = -1;
      valid = false;
    }
  }

  if (table.size() != _primChildrenIndices.size()) {
    // duplicated index exists.
    valid = false;
  }

  _primChildrenIndicesIsValid = valid;
  if (indices_is_valid) {
    (*indices_is_valid) = _primChildrenIndicesIsValid;
  }

  return _primChildrenIndices;
}